

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

void charSetToUSet(uint32_t *cset,USetAdder *sa)

{
  UBool UVar1;
  UErrorCode local_324;
  UErrorCode local_320;
  UErrorCode errorCode;
  int32_t length;
  int32_t i;
  char cs [256];
  UChar us [256];
  USetAdder *sa_local;
  uint32_t *cset_local;
  
  local_324 = U_ZERO_ERROR;
  UVar1 = icu_63::calcNameSetsLengths(&local_324);
  if (UVar1 != '\0') {
    local_320 = U_ZERO_ERROR;
    for (errorCode = U_ZERO_ERROR; errorCode < 0x100;
        errorCode = errorCode + U_ILLEGAL_ARGUMENT_ERROR) {
      if ((cset[(errorCode & 0xff) >> 5] & 1 << ((byte)errorCode & 0x1f)) != 0) {
        *(byte *)((long)&length + (long)local_320) = (byte)errorCode;
        local_320 = local_320 + U_ILLEGAL_ARGUMENT_ERROR;
      }
    }
    u_charsToUChars_63((char *)&length,(UChar *)(cs + 0xf8),local_320);
    for (errorCode = U_ZERO_ERROR; errorCode < local_320;
        errorCode = errorCode + U_ILLEGAL_ARGUMENT_ERROR) {
      if ((us[(long)errorCode + -4] != L'\0') ||
         (*(char *)((long)&length + (long)errorCode) == '\0')) {
        (*(code *)sa->add)(sa->set,us[(long)errorCode + -4]);
      }
    }
  }
  return;
}

Assistant:

static void
charSetToUSet(uint32_t cset[8], const USetAdder *sa) {
    UChar us[256];
    char cs[256];

    int32_t i, length;
    UErrorCode errorCode;

    errorCode=U_ZERO_ERROR;

    if(!calcNameSetsLengths(&errorCode)) {
        return;
    }

    /* build a char string with all chars that are used in character names */
    length=0;
    for(i=0; i<256; ++i) {
        if(SET_CONTAINS(cset, i)) {
            cs[length++]=(char)i;
        }
    }

    /* convert the char string to a UChar string */
    u_charsToUChars(cs, us, length);

    /* add each UChar to the USet */
    for(i=0; i<length; ++i) {
        if(us[i]!=0 || cs[i]==0) { /* non-invariant chars become (UChar)0 */
            sa->add(sa->set, us[i]);
        }
    }
}